

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastObjectIsIn(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  RegOpnd *pRVar2;
  RegOpnd *pRVar3;
  RegOpnd *pRVar4;
  bool bVar5;
  uint32 uVar6;
  uint32 uVar7;
  Opnd *pOVar8;
  LabelInstr *labelHelper;
  LabelInstr *labelDone;
  undefined4 *puVar9;
  byte local_69;
  byte local_59;
  uint32 hitRateOffset_1;
  uint32 inlineCacheOffset_1;
  uint32 hitRateOffset;
  uint32 inlineCacheOffset;
  LabelInstr *doneLabel;
  LabelInstr *helperLabel;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_30;
  byte local_2d;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  byte local_29;
  bool likelySymbolIndex;
  RegOpnd *pRStack_28;
  bool likelyStringIndex;
  RegOpnd *indexOpnd;
  RegOpnd *baseOpnd;
  Instr *instr_local;
  Lowerer *this_local;
  
  baseOpnd = (RegOpnd *)instr;
  instr_local = (Instr *)this;
  pOVar8 = IR::Instr::GetSrc2(instr);
  indexOpnd = GetRegOpnd(this,pOVar8,(Instr *)baseOpnd,this->m_func,TyVar);
  pOVar8 = IR::Instr::GetSrc1((Instr *)baseOpnd);
  pRStack_28 = GetRegOpnd(this,pOVar8,(Instr *)baseOpnd,this->m_func,TyVar);
  local_2c.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_28->super_Opnd);
  local_29 = ValueType::IsLikelyString((ValueType *)&local_2c.field_0);
  local_30.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&pRStack_28->super_Opnd);
  local_2d = ValueType::IsLikelySymbol((ValueType *)&local_30.field_0);
  helperLabel._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&indexOpnd->super_Opnd);
  bVar5 = ValueType::IsLikelyObject((ValueType *)((long)&helperLabel + 6));
  local_59 = 1;
  if (bVar5) {
    local_69 = 1;
    if ((local_29 & 1) == 0) {
      local_69 = local_2d;
    }
    local_59 = local_69 ^ 0xff;
  }
  if ((local_59 & 1) == 0) {
    labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
    labelDone = IR::LabelInstr::New(Label,this->m_func,false);
    if ((local_29 & 1) == 0) {
      if ((local_2d & 1) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x51eb,"(likelySymbolIndex)","likelySymbolIndex");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      GenerateSymbolTest(this,pRStack_28,(Instr *)baseOpnd,labelHelper,(LabelInstr *)0x0,true);
      uVar6 = Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
      uVar7 = Js::JavascriptSymbol::GetOffsetOfHitRate();
      pRVar4 = baseOpnd;
      pRVar3 = indexOpnd;
      pRVar2 = pRStack_28;
      pOVar8 = IR::Instr::GetDst((Instr *)baseOpnd);
      GenerateFastIsInSymbolOrStringIndex
                (this,(Instr *)pRVar4,pRVar2,pRVar3,pOVar8,uVar6,uVar7,labelHelper,labelDone);
    }
    else {
      GeneratePropertyStringTest(this,pRStack_28,(Instr *)baseOpnd,labelHelper,false);
      uVar6 = Js::PropertyString::GetOffsetOfLdElemInlineCache();
      uVar7 = Js::PropertyString::GetOffsetOfHitRate();
      pRVar4 = baseOpnd;
      pRVar3 = indexOpnd;
      pRVar2 = pRStack_28;
      pOVar8 = IR::Instr::GetDst((Instr *)baseOpnd);
      GenerateFastIsInSymbolOrStringIndex
                (this,(Instr *)pRVar4,pRVar2,pRVar3,pOVar8,uVar6,uVar7,labelHelper,labelDone);
    }
    IR::Instr::InsertBefore((Instr *)baseOpnd,&labelHelper->super_Instr);
    IR::Instr::InsertAfter((Instr *)baseOpnd,&labelDone->super_Instr);
  }
  return;
}

Assistant:

void Lowerer::GenerateFastObjectIsIn(IR::Instr * instr)
{
    IR::RegOpnd* baseOpnd = GetRegOpnd(instr->GetSrc2(), instr, m_func, TyVar);
    IR::RegOpnd* indexOpnd = GetRegOpnd(instr->GetSrc1(), instr, m_func, TyVar);
    bool likelyStringIndex = indexOpnd->GetValueType().IsLikelyString();
    bool likelySymbolIndex = indexOpnd->GetValueType().IsLikelySymbol();

    if (!baseOpnd->GetValueType().IsLikelyObject() || !(likelyStringIndex || likelySymbolIndex))
    {
        return;
    }

    IR::LabelInstr* helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr* doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    if (likelyStringIndex)
    {
        GeneratePropertyStringTest(indexOpnd, instr, helperLabel, false /*isStore*/);

        const uint32 inlineCacheOffset = Js::PropertyString::GetOffsetOfLdElemInlineCache();
        const uint32 hitRateOffset = Js::PropertyString::GetOffsetOfHitRate();

        GenerateFastIsInSymbolOrStringIndex(instr, indexOpnd, baseOpnd, instr->GetDst(), inlineCacheOffset, hitRateOffset, helperLabel, doneLabel);
    }
    else
    {
        Assert(likelySymbolIndex);

        GenerateSymbolTest(indexOpnd, instr, helperLabel);

        const uint32 inlineCacheOffset = Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
        const uint32 hitRateOffset = Js::JavascriptSymbol::GetOffsetOfHitRate();

        GenerateFastIsInSymbolOrStringIndex(instr, indexOpnd, baseOpnd, instr->GetDst(), inlineCacheOffset, hitRateOffset, helperLabel, doneLabel);
    }

    instr->InsertBefore(helperLabel);
    instr->InsertAfter(doneLabel);
}